

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void notValidImpl(Parse *pParse,NameContext *pNC,char *zMsg,Expr *pExpr,Expr *pError)

{
  undefined1 *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  Parse *in_RDI;
  Expr *in_R8;
  char *zIn;
  char *local_30;
  
  local_30 = "partial index WHERE clauses";
  if ((*(uint *)(in_RSI + 0x28) & 0x20) == 0) {
    if ((*(uint *)(in_RSI + 0x28) & 4) == 0) {
      if ((*(uint *)(in_RSI + 0x28) & 8) != 0) {
        local_30 = "generated columns";
      }
    }
    else {
      local_30 = "CHECK constraints";
    }
  }
  else {
    local_30 = "index expressions";
  }
  sqlite3ErrorMsg(in_RDI,"%s prohibited in %s",in_RDX,local_30);
  if (in_RCX != (undefined1 *)0x0) {
    *in_RCX = 0x7a;
  }
  sqlite3RecordErrorOffsetOfExpr(in_RDI->db,in_R8);
  return;
}

Assistant:

static void notValidImpl(
   Parse *pParse,       /* Leave error message here */
   NameContext *pNC,    /* The name context */
   const char *zMsg,    /* Type of error */
   Expr *pExpr,         /* Invalidate this expression on error */
   Expr *pError         /* Associate error with this expression */
){
  const char *zIn = "partial index WHERE clauses";
  if( pNC->ncFlags & NC_IdxExpr )      zIn = "index expressions";
#ifndef SQLITE_OMIT_CHECK
  else if( pNC->ncFlags & NC_IsCheck ) zIn = "CHECK constraints";
#endif
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
  else if( pNC->ncFlags & NC_GenCol ) zIn = "generated columns";
#endif
  sqlite3ErrorMsg(pParse, "%s prohibited in %s", zMsg, zIn);
  if( pExpr ) pExpr->op = TK_NULL;
  sqlite3RecordErrorOffsetOfExpr(pParse->db, pError);
}